

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

void __thiscall
HashMap<String,_Variant>::HashMap(HashMap<String,_Variant> *this,HashMap<String,_Variant> *other)

{
  Item *end;
  Item *i;
  HashMap<String,_Variant> *other_local;
  HashMap<String,_Variant> *this_local;
  
  Iterator::Iterator(&this->_end,&this->endItem);
  Iterator::Iterator(&this->_begin,&this->endItem);
  this->_size = 0;
  this->capacity = 500;
  this->data = (Item **)0x0;
  Item::Item(&this->endItem);
  this->freeItem = (Item *)0x0;
  this->blocks = (ItemBlock *)0x0;
  (this->endItem).prev = (Item *)0x0;
  (this->endItem).next = (Item *)0x0;
  for (end = (other->_begin).item; end != &other->endItem; end = end->next) {
    append(this,&end->key,&end->value);
  }
  return;
}

Assistant:

HashMap(const HashMap& other) : _end(&endItem), _begin(&endItem), _size(0), capacity(500), data(0), freeItem(0), blocks(0)
  {
    endItem.prev = 0;
    endItem.next = 0;
    for(const Item* i = other._begin.item, * end = &other.endItem; i != end; i = i->next)
      append(i->key, i->value);
  }